

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

CheckerDeclarationSyntax * __thiscall
slang::parsing::Parser::parseCheckerDeclaration(Parser *this,AttrList attributes)

{
  SyntaxNode *pSVar1;
  Token semi;
  Info *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  Diagnostic *this_00;
  SourceLocation SVar7;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  CheckerDeclarationSyntax *pCVar8;
  bool bVar9;
  byte bVar10;
  BumpAllocator *dst;
  bool bVar11;
  Token TVar12;
  SourceRange range;
  string_view arg;
  Token keyword;
  Token name;
  bool anyLocalModules;
  Token *local_148;
  SyntaxKind local_13c;
  MemberSyntax *member;
  Info *local_130;
  undefined8 local_128;
  AssertionItemPortListSyntax *local_120;
  pointer local_118;
  size_t local_110;
  Info *local_108;
  undefined8 local_100;
  Info *local_f8;
  undefined8 local_f0;
  Token *local_e8;
  Token end;
  SyntaxList<slang::syntax::MemberSyntax> local_d0;
  undefined8 local_98;
  Info *pIStack_90;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  
  local_110 = (size_t)attributes._M_extent._M_extent_value;
  local_118 = attributes._M_ptr;
  TVar12 = ParserBase::consume(&this->super_ParserBase);
  local_f8 = TVar12.info;
  local_f0 = TVar12._0_8_;
  TVar12 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_108 = TVar12.info;
  local_100 = TVar12._0_8_;
  local_120 = parseAssertionItemPortList(this,CheckerDeclaration);
  TVar12 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_130 = TVar12.info;
  local_128 = TVar12._0_8_;
  local_13c = this->currentDefinitionKind;
  this->currentDefinitionKind = CheckerDeclaration;
  Token::Token(&end);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 8;
  anyLocalModules = false;
  local_148 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_e8 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar9 = false;
  while( true ) {
    TVar12 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar12.kind == EndOfFile) || ((TVar12._0_4_ & 0xffff) == 0x90)) break;
    member = parseMember(this,CheckerDeclaration,&anyLocalModules);
    bVar11 = member == (MemberSyntax *)0x0;
    if (bVar11) {
      bVar5 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar12.kind);
      if (bVar5) {
        local_d0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        range = Token::range((Token *)&local_d0);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_d0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText((Token *)&local_d0);
        Diagnostic::operator<<(this_00,arg);
        bVar10 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar10 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar7 = Token::location(local_148);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar7);
          SVar7 = Token::location(local_e8);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar7);
          bVar10 = 0;
        }
      }
      else {
        bVar10 = ~bVar9 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar10 << 0x20 | 0x450005));
      bVar9 = bVar11;
    }
    else {
      checkMemberAllowed(this,&member->super_SyntaxNode,CheckerDeclaration);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&members,&member);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (member->super_SyntaxNode).previewNode = pSVar1;
      bVar9 = bVar11;
    }
  }
  if (anyLocalModules == true) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  end = ParserBase::expect(&this->super_ParserBase,EndCheckerKeyword);
  dst = (this->super_ParserBase).alloc;
  iVar6 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                     (EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)end.info);
  local_148 = (Token *)CONCAT44(extraout_var,iVar6);
  SmallVectorBase<slang::syntax::MemberSyntax_*>::cleanup
            (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,(EVP_PKEY_CTX *)dst);
  this->currentDefinitionKind = local_13c;
  endBlock = parseNamedBlockClause(this);
  uVar3 = local_100;
  pIVar2 = local_108;
  TVar12.info = local_108;
  TVar12.kind = (undefined2)local_100;
  TVar12._2_1_ = local_100._2_1_;
  TVar12.numFlags.raw = local_100._3_1_;
  TVar12.rawLen = local_100._4_4_;
  checkBlockNames(this,TVar12,endBlock);
  uVar4 = local_100;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
       CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
  members.stackBase[0] = (undefined1)local_110;
  members.stackBase[1] = local_110._1_1_;
  members.stackBase[2] = local_110._2_1_;
  members.stackBase[3] = local_110._3_1_;
  members.stackBase[4] = local_110._4_1_;
  members.stackBase[5] = local_110._5_1_;
  members.stackBase[6] = local_110._6_1_;
  members.stackBase[7] = local_110._7_1_;
  members.stackBase._8_8_ = local_118;
  members.stackBase[0x10] = (undefined1)local_110;
  members.stackBase[0x11] = local_110._1_1_;
  members.stackBase[0x12] = local_110._2_1_;
  members.stackBase[0x13] = local_110._3_1_;
  members.stackBase[0x14] = local_110._4_1_;
  members.stackBase[0x15] = local_110._5_1_;
  members.stackBase[0x16] = local_110._6_1_;
  members.stackBase[0x17] = local_110._7_1_;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)&PTR_getChild_005e8088;
  local_98 = local_128;
  pIStack_90 = local_130;
  local_d0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_d0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_d0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_d0.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)local_148;
  local_d0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e86f8;
  semi.info = local_130;
  semi.kind = (undefined2)local_128;
  semi._2_1_ = local_128._2_1_;
  semi.numFlags.raw = local_128._3_1_;
  semi.rawLen = local_128._4_4_;
  keyword.info = local_f8;
  keyword.kind = (undefined2)local_f0;
  keyword._2_1_ = local_f0._2_1_;
  keyword.numFlags.raw = local_f0._3_1_;
  keyword.rawLen = local_f0._4_4_;
  name.info = pIVar2;
  local_100._0_2_ = (undefined2)uVar3;
  local_100._2_1_ = SUB81(uVar3,2);
  local_100._3_1_ = SUB81(uVar3,3);
  local_100._4_4_ = SUB84(uVar3,4);
  name.kind = (undefined2)local_100;
  name._2_1_ = local_100._2_1_;
  name.numFlags.raw = local_100._3_1_;
  name.rawLen = local_100._4_4_;
  local_100 = uVar4;
  pCVar8 = slang::syntax::SyntaxFactory::checkerDeclaration
                     (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,
                      keyword,name,local_120,semi,&local_d0,end,endBlock);
  return pCVar8;
}

Assistant:

CheckerDeclarationSyntax& Parser::parseCheckerDeclaration(AttrList attributes) {
    auto keyword = consume();
    auto name = expect(TokenKind::Identifier);
    auto portList = parseAssertionItemPortList(SyntaxKind::CheckerDeclaration);
    auto semi = expect(TokenKind::Semicolon);

    auto savedDefinitionKind = currentDefinitionKind;
    currentDefinitionKind = SyntaxKind::CheckerDeclaration;

    Token end;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndCheckerKeyword, end, SyntaxKind::CheckerDeclaration,
        [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    currentDefinitionKind = savedDefinitionKind;

    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.checkerDeclaration(attributes, keyword, name, portList, semi, members, end,
                                      blockName);
}